

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O2

Comment * soul::SourceCodeUtilities::getFileSummaryComment
                    (Comment *__return_storage_ptr__,CodeLocation *file)

{
  bool bVar1;
  Comment firstComment;
  CodeLocation local_98;
  CodeLocation local_88;
  CodeLocation local_78;
  CodeLocation local_68;
  Comment local_58;
  
  local_68.sourceCode.object = (file->sourceCode).object;
  if (local_68.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_68.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_68.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_68.location.data = (file->location).data;
  parseComment(&local_58,&local_68);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_68.sourceCode);
  if (local_58.isDoxygenStyle == true) {
    local_78.sourceCode.object = local_58.range.end.sourceCode.object;
    if (local_58.range.end.sourceCode.object != (SourceCodeText *)0x0) {
      ((local_58.range.end.sourceCode.object)->super_RefCountedObject).refCount =
           ((local_58.range.end.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    local_78.location.data = local_58.range.end.location.data;
    bVar1 = isFollowedByBlankLine(&local_78);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_78.sourceCode);
    if (bVar1) {
      Comment::Comment(__return_storage_ptr__,&local_58);
      goto LAB_00210031;
    }
  }
  if (local_58.valid == true) {
    local_88.sourceCode.object = local_58.range.end.sourceCode.object;
    if (local_58.range.end.sourceCode.object != (SourceCodeText *)0x0) {
      ((local_58.range.end.sourceCode.object)->super_RefCountedObject).refCount =
           ((local_58.range.end.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    local_88.location.data = local_58.range.end.location.data;
    parseComment(__return_storage_ptr__,&local_88);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_88.sourceCode);
    if (__return_storage_ptr__->isDoxygenStyle == true) {
      local_98.sourceCode.object = (__return_storage_ptr__->range).end.sourceCode.object;
      if (local_98.sourceCode.object != (SourceCodeText *)0x0) {
        ((local_98.sourceCode.object)->super_RefCountedObject).refCount =
             ((local_98.sourceCode.object)->super_RefCountedObject).refCount + 1;
      }
      local_98.location.data = (__return_storage_ptr__->range).end.location.data;
      bVar1 = isFollowedByBlankLine(&local_98);
      RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_98.sourceCode);
      if (bVar1) goto LAB_00210031;
    }
    Comment::~Comment(__return_storage_ptr__);
  }
  __return_storage_ptr__->valid = false;
  __return_storage_ptr__->isStarSlash = false;
  __return_storage_ptr__->isDoxygenStyle = false;
  __return_storage_ptr__->isReferringBackwards = false;
  (__return_storage_ptr__->lines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->lines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->lines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->range).start.sourceCode.object = (SourceCodeText *)0x0;
  (__return_storage_ptr__->range).start.location.data = (char *)0x0;
  (__return_storage_ptr__->range).end.sourceCode.object = (SourceCodeText *)0x0;
  (__return_storage_ptr__->range).end.location.data = (char *)0x0;
LAB_00210031:
  Comment::~Comment(&local_58);
  return __return_storage_ptr__;
}

Assistant:

SourceCodeUtilities::Comment SourceCodeUtilities::getFileSummaryComment (CodeLocation file)
{
    auto firstComment = parseComment (file);

    if (firstComment.isDoxygenStyle && isFollowedByBlankLine (firstComment.range.end))
        return firstComment;

    if (firstComment.valid)
    {
        auto secondComment = parseComment (firstComment.range.end);

        if (secondComment.isDoxygenStyle && isFollowedByBlankLine (secondComment.range.end))
            return secondComment;
    }

    return {};
}